

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieparser.cpp
# Opt level: O1

void __thiscall
LottieParserImpl::parsePropertyHelper<VPointF,void>
          (LottieParserImpl *this,Property<VPointF,_void> *obj)

{
  LookaheadParsingState LVar1;
  bool bVar2;
  details dVar3;
  uint uVar4;
  
  if (((this->super_LookaheadParserHandler).st_ - kHasNull < 5) &&
     (((this->super_LookaheadParserHandler).v_.data_.f.flags & 7) == 6)) {
LAB_0013a867:
    if (obj->isValue_ != false) {
      getValue(this,(VPointF *)obj);
      return;
    }
    (this->super_LookaheadParserHandler).st_ = kError;
  }
  else {
    EnterArray(this);
    bVar2 = NextArrayValue(this);
    if (bVar2) {
      do {
        LVar1 = (this->super_LookaheadParserHandler).st_;
        if (LVar1 - kHasNull < 5) {
          uVar4 = (this->super_LookaheadParserHandler).v_.data_.f.flags & 7;
        }
        else {
          uVar4 = (uint)(LVar1 == kEnteringObject) * 4 - 1;
          if (LVar1 == kEnteringArray) {
            uVar4 = 4;
          }
        }
        if (uVar4 != 3) goto LAB_0013a867;
        if (obj->isValue_ == true) {
          dVar3 = (details)operator_new(0x18);
          *(undefined8 *)dVar3 = 0;
          *(undefined8 *)((long)dVar3 + 8) = 0;
          *(undefined8 *)((long)dVar3 + 0x10) = 0;
          obj->impl_ = dVar3;
          obj->isValue_ = false;
        }
        parseKeyFrame<VPointF,void>(this,(KeyFrames<VPointF,_void> *)obj->impl_);
        bVar2 = NextArrayValue(this);
      } while (bVar2);
    }
  }
  return;
}

Assistant:

void LottieParserImpl::parsePropertyHelper(model::Property<T, Tag> &obj)
{
    if (PeekType() == kNumberType) {
        if (!obj.isStatic()) {
            st_ = kError;
            return;
        }
        /*single value property with no animation*/
        getValue(obj.value());
    } else {
        EnterArray();
        while (NextArrayValue()) {
            /* property with keyframe info*/
            if (PeekType() == kObjectType) {
                parseKeyFrame(obj.animation());
            } else {
                /* Read before modifying.
                 * as there is no way of knowing if the
                 * value of the array is either array of numbers
                 * or array of object without entering the array
                 * thats why this hack is there
                 */
                if (!obj.isStatic()) {
                    st_ = kError;
                    return;
                }
                /*multi value property with no animation*/
                getValue(obj.value());
                /*break here as we already reached end of array*/
                break;
            }
        }
        obj.cache();
    }
}